

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

CharCount __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::RepeatCount
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this)

{
  byte bVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  byte *pbVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  pbVar5 = this->next;
  iVar7 = 0;
  uVar8 = 0;
  while( true ) {
    if (this->inputLim < pbVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ec743e;
      *puVar4 = 0;
      pbVar5 = this->next;
    }
    bVar6 = *pbVar5;
    if ((ASCIIChars::classes[bVar6] & 0x10) == 0) {
      if (iVar7 != 0) {
        return uVar8;
      }
      Fail(this,-0x7ff5ec67);
      return uVar8;
    }
    if (0xccccccc < uVar8) break;
    bVar1 = ASCIIChars::values[bVar6];
    if (0x7ffffffe - bVar1 < uVar8 * 10) break;
    if (this->inputLim < pbVar5 + 1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00ec743e;
      *puVar4 = 0;
      pbVar5 = this->next;
      bVar6 = *pbVar5;
    }
    if ((char)bVar6 < '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])"
                        );
      if (!bVar3) goto LAB_00ec743e;
      *puVar4 = 0;
      pbVar5 = this->next;
    }
    uVar8 = uVar8 * 10 + (uint)bVar1;
    pbVar5 = pbVar5 + 1;
    this->next = pbVar5;
    iVar7 = iVar7 + -1;
  }
  if (iVar7 != 0) goto LAB_00ec7327;
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  *puVar4 = 1;
  bVar3 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                     ,0x47c,"(digits != 0)","digits != 0");
  if (bVar3) {
    *puVar4 = 0;
    pbVar5 = this->next;
    goto LAB_00ec7327;
  }
LAB_00ec743e:
  pcVar2 = (code *)invalidInstructionException();
  (*pcVar2)();
LAB_00ec7327:
  if (this->inputLim < pbVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ec743e;
    *puVar4 = 0;
    pbVar5 = this->next;
  }
  bVar6 = *pbVar5;
  if ((ASCIIChars::classes[bVar6] & 0x10) == 0) {
    return 0x7ffffffe;
  }
  if (this->inputLim < pbVar5 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00ec743e;
    *puVar4 = 0;
    pbVar5 = this->next;
    bVar6 = *pbVar5;
  }
  if ((char)bVar6 < '\0') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xd6,"(!this->IsMultiUnitChar(next[i]))","!this->IsMultiUnitChar(next[i])");
    if (!bVar3) goto LAB_00ec743e;
    *puVar4 = 0;
    pbVar5 = this->next;
  }
  pbVar5 = pbVar5 + 1;
  this->next = pbVar5;
  goto LAB_00ec7327;
}

Assistant:

CharCount Parser<P, IsLiteral>::RepeatCount()
    {
        CharCount n = 0;
        int digits = 0;
        while (true)
        {
            // Could be terminating 0
            EncodedChar ec = ECLookahead();
            if (!standardEncodedChars->IsDigit(ec))
            {
                if (digits == 0)
                {
                    Fail(JSERR_RegExpSyntax);
                }

                return n;
            }

            if (n > MaxCharCount / 10)
            {
                break;
            }

            n *= 10;
            if (n > MaxCharCount - standardEncodedChars->DigitValue(ec))
            {
                break;
            }

            n += standardEncodedChars->DigitValue(ec);
            digits++;
            ECConsume();
        }

        Assert(digits != 0); // shouldn't be able to reach here with (digits == 0)

        // The token had a value larger than MaxCharCount so we didn't return the value and reached here instead.
        // Consume the rest of the token and return MaxCharCount.
        while (true)
        {
            EncodedChar ec = ECLookahead();
            if (!standardEncodedChars->IsDigit(ec))
            {
                return MaxCharCount;
            }
            ECConsume();
        }
    }